

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int sort_comp(lua_State *L,int a,int b)

{
  StkId pTVar1;
  uint uVar2;
  int iVar3;
  TValue *o1;
  TValue *pTVar4;
  TValue *pTVar5;
  
  pTVar4 = L->top;
  pTVar5 = L->base + 1;
  if (pTVar4 <= pTVar5) {
    pTVar5 = &luaO_nilobject_;
  }
  if ((pTVar5 == &luaO_nilobject_) || (pTVar5->tt != 0)) {
    pTVar4->value = pTVar5->value;
    pTVar4->tt = pTVar5->tt;
    L->top = L->top + 1;
    pTVar4 = index2adr(L,a + -1);
    pTVar1 = L->top;
    pTVar1->value = pTVar4->value;
    pTVar1->tt = pTVar4->tt;
    L->top = L->top + 1;
    pTVar4 = index2adr(L,b + -2);
    pTVar1 = L->top;
    pTVar1->value = pTVar4->value;
    pTVar1->tt = pTVar4->tt;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    luaD_call(L,pTVar1 + -2,1);
    pTVar1 = L->top;
    uVar2 = pTVar1[-1].tt;
    if (uVar2 != 0) {
      if (uVar2 == 1) {
        uVar2 = (uint)(pTVar1[-1].value.b != 0);
      }
      else {
        uVar2 = 1;
      }
    }
    L->top = pTVar1 + -1;
  }
  else {
    pTVar4 = index2adr(L,a);
    pTVar5 = index2adr(L,b);
    uVar2 = 0;
    if (pTVar5 != &luaO_nilobject_ && pTVar4 != &luaO_nilobject_) {
      iVar3 = luaV_lessthan(L,pTVar4,pTVar5);
      return iVar3;
    }
  }
  return uVar2;
}

Assistant:

static int sort_comp(lua_State*L,int a,int b){
if(!lua_isnil(L,2)){
int res;
lua_pushvalue(L,2);
lua_pushvalue(L,a-1);
lua_pushvalue(L,b-2);
lua_call(L,2,1);
res=lua_toboolean(L,-1);
lua_pop(L,1);
return res;
}
else
return lua_lessthan(L,a,b);
}